

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int buffer_insert_pages(bfy_buffer *buf,size_t pos,bfy_page *new_pages,size_t new_len)

{
  int8_t *piVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bfy_unref_cb *pbVar5;
  undefined4 uVar6;
  ulong uVar7;
  bfy_buffer *pbVar8;
  long lVar9;
  bfy_page *pbVar10;
  ulong uVar11;
  bfy_buffer *pbVar12;
  ulong uVar13;
  size_t *psVar14;
  
  if (new_pages == (bfy_page *)0x0 || new_len == 0) {
    return 0;
  }
  pbVar8 = (bfy_buffer *)buf->pages;
  if (new_len == 1) {
    if (pbVar8 == (bfy_buffer *)0x0) {
      if ((buf->page).data == (int8_t *)0x0) {
        (buf->page).unref_arg = new_pages->unref_arg;
        piVar1 = new_pages->data;
        sVar2 = new_pages->size;
        sVar3 = new_pages->read_pos;
        sVar4 = new_pages->write_pos;
        uVar6 = *(undefined4 *)&new_pages->field_0x24;
        pbVar5 = new_pages->unref_cb;
        (buf->page).flags = new_pages->flags;
        *(undefined4 *)&(buf->page).field_0x24 = uVar6;
        (buf->page).unref_cb = pbVar5;
        (buf->page).read_pos = sVar3;
        (buf->page).write_pos = sVar4;
        (buf->page).data = piVar1;
        (buf->page).size = sVar2;
        lVar9 = new_pages->write_pos - new_pages->read_pos;
        buf->content_len = buf->content_len + lVar9;
        goto LAB_0015f4e2;
      }
      goto LAB_0015f3cb;
    }
LAB_0015f3b0:
    pbVar10 = &pbVar8->page + buf->n_pages;
    pbVar12 = pbVar8;
  }
  else {
    if (pbVar8 != (bfy_buffer *)0x0) goto LAB_0015f3b0;
LAB_0015f3cb:
    pbVar10 = (bfy_page *)&buf->pages;
    pbVar8 = (bfy_buffer *)0x0;
    pbVar12 = buf;
  }
  uVar13 = ((long)pbVar10 - (long)pbVar12 >> 3) * 0x6db6db6db6db6db7 + new_len;
  if (buf->n_pages_alloc < uVar13) {
    uVar7 = 0x10;
    do {
      uVar11 = uVar7;
      uVar7 = uVar11 * 2;
    } while (uVar11 < uVar13);
    pbVar8 = (bfy_buffer *)(*allocator.realloc)(pbVar8,uVar11 * 0x38);
    if (pbVar8 == (bfy_buffer *)0x0) {
      pbVar8 = (bfy_buffer *)buf->pages;
      goto LAB_0015f421;
    }
    buf->pages = (bfy_page *)pbVar8;
    buf->n_pages_alloc = uVar11;
  }
  else {
LAB_0015f421:
    if (pbVar8 == (bfy_buffer *)0x0) {
      return -1;
    }
  }
  uVar13 = buf->n_pages;
  if (uVar13 == 0) {
    if ((buf->page).data != (int8_t *)0x0) {
      buf->n_pages = 1;
      (pbVar8->page).unref_arg = (buf->page).unref_arg;
      piVar1 = (buf->page).data;
      sVar2 = (buf->page).size;
      sVar3 = (buf->page).read_pos;
      sVar4 = (buf->page).write_pos;
      uVar6 = *(undefined4 *)&(buf->page).field_0x24;
      pbVar5 = (buf->page).unref_cb;
      (pbVar8->page).flags = (buf->page).flags;
      *(undefined4 *)&(pbVar8->page).field_0x24 = uVar6;
      (pbVar8->page).unref_cb = pbVar5;
      (pbVar8->page).read_pos = sVar3;
      (pbVar8->page).write_pos = sVar4;
      (pbVar8->page).data = piVar1;
      (pbVar8->page).size = sVar2;
      (buf->page).data = (int8_t *)0x0;
      (buf->page).size = 0;
      (buf->page).read_pos = 0;
      (buf->page).write_pos = 0;
      *(undefined8 *)&(buf->page).flags = 0;
      (buf->page).unref_cb = (bfy_unref_cb *)0x0;
      (buf->page).unref_arg = (void *)0x0;
      pbVar8 = (bfy_buffer *)buf->pages;
      uVar13 = buf->n_pages;
      goto LAB_0015f479;
    }
    uVar13 = 0;
  }
  else {
LAB_0015f479:
    if (pos < uVar13) {
      memmove(&pbVar8->page + pos + new_len,&pbVar8->page + pos,(uVar13 - pos) * 0x38);
      pbVar8 = (bfy_buffer *)buf->pages;
      uVar13 = pos;
    }
  }
  memcpy(&pbVar8->page + uVar13,new_pages,new_len * 0x38);
  buf->n_pages = buf->n_pages + new_len;
  psVar14 = &new_pages->write_pos;
  lVar9 = 0;
  do {
    lVar9 = (lVar9 - psVar14[-1]) + *psVar14;
    psVar14 = psVar14 + 7;
    new_len = new_len - 1;
  } while (new_len != 0);
  buf->content_len = buf->content_len + lVar9;
LAB_0015f4e2:
  if (buf->changed_muted == 0) {
    psVar14 = &(buf->changed_info).n_added;
    *psVar14 = *psVar14 + lVar9;
    buffer_check_changed_cb(buf);
  }
  return 0;
}

Assistant:

static int
buffer_insert_pages(bfy_buffer* buf, size_t pos,
                    struct bfy_page const* new_pages,
                    size_t new_len) {
    if (new_len == 0 || new_pages == NULL) {
        return 0;
    }

    // if we have nothing, use buf->page
    if (new_len == 1 && buf->pages == NULL && buf->page.data == NULL) {
        buf->page = *new_pages;
        buffer_record_content_added(buf, page_get_content_len(new_pages));
        return 0;
    }

    // ensure we have enough space in buf->pages
    size_t n_pages_alloc = buffer_count_pages(buf) + new_len;
    size_t const pagesize = sizeof(struct bfy_page);
    if (n_pages_alloc > buf->n_pages_alloc) {
        n_pages_alloc = pick_capacity(16, n_pages_alloc);
        void* pages = allocator.realloc(buf->pages, pagesize * n_pages_alloc);
        if (pages != NULL) {
            buf->pages = pages;
            buf->n_pages_alloc = n_pages_alloc;
        }
    }
    if (buf->pages == NULL) {
        return -1;
    }

    // if we had 1 page and are inserting more, handle the special case
    // of moving the single buf->page into the multipage array
    if (buf->n_pages == 0 && buf->page.data != NULL) {
        buf->n_pages = 1;
        *buf->pages = buf->page;
        buf->page = InitPage;
    }

    // insert new_pages into buf->pages
    pos = size_t_min(pos, buf->n_pages);
    if (buf->n_pages > pos) {
        memmove(buf->pages + pos + new_len, buf->pages + pos, pagesize * (buf->n_pages - pos));
    }
    memcpy(buf->pages + pos, new_pages, pagesize * new_len);
    buf->n_pages += new_len;

    // record the new content
    size_t new_content_len = 0;
    for (size_t i = 0; i < new_len; ++i) {
        new_content_len += page_get_content_len(new_pages + i);
    }
    buffer_record_content_added(buf, new_content_len);
    return 0;
}